

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ordering.cpp
# Opt level: O2

DArray<int> *
Kernel::PrecedenceOrdering::funcPrecFromOpts
          (DArray<int> *__return_storage_ptr__,Problem *prb,Options *opt)

{
  int *piVar1;
  undefined1 auVar2 [12];
  char cVar3;
  istream *piVar4;
  ulong uVar5;
  ulong uVar6;
  DArray<unsigned_int> aux;
  string precedence;
  ifstream precedence_file;
  
  uVar6 = (ulong)(*(long *)(DAT_00a14190 + 0x68) - *(long *)(DAT_00a14190 + 0x60)) >> 3;
  uVar5 = uVar6 & 0xffffffff;
  Lib::DArray<unsigned_int>::DArray(&aux,uVar5);
  if ((uint)uVar6 != 0) {
    auVar2._4_8_ = 0;
    auVar2._0_4_ = (uint)uVar6;
    Lib::DArray<unsigned_int>::initFromIterator<Lib::RangeIterator<unsigned_int>>
              (&aux,(RangeIterator<unsigned_int>)(auVar2 << 0x40),uVar5);
    if ((opt->_functionPrecedence).
        super_OptionValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .actualValue._M_string_length == 0) {
      sortAuxBySymbolPrecedence(&aux,opt,FUNC);
    }
    else {
      precedence._M_dataplus._M_p = (pointer)&precedence.field_2;
      precedence._M_string_length = 0;
      precedence.field_2._M_local_buf[0] = '\0';
      std::ifstream::ifstream
                (&precedence_file,
                 (opt->_functionPrecedence).
                 super_OptionValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 .actualValue._M_dataplus._M_p,_S_in);
      cVar3 = std::__basic_file<char>::is_open();
      if (cVar3 != '\0') {
        piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                           ((istream *)&precedence_file,(string *)&precedence);
        if (((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 5) == 0) {
          loadPermutationFromString(&aux,&precedence);
          std::ifstream::close();
        }
      }
      std::ifstream::~ifstream(&precedence_file);
      std::__cxx11::string::~string((string *)&precedence);
    }
  }
  Lib::DArray<int>::DArray(__return_storage_ptr__,uVar5);
  piVar1 = __return_storage_ptr__->_array;
  for (uVar5 = 0; (uVar6 & 0xffffffff) != uVar5; uVar5 = uVar5 + 1) {
    piVar1[aux._array[uVar5]] = (int)uVar5;
  }
  Lib::DArray<unsigned_int>::~DArray(&aux);
  return __return_storage_ptr__;
}

Assistant:

DArray<int> PrecedenceOrdering::funcPrecFromOpts(Problem& prb, const Options& opt) {
  unsigned nFunctions = env.signature->functions();
  DArray<unsigned> aux(nFunctions);

  if(nFunctions) {
    aux.initFromIterator(getRangeIterator(0u, nFunctions), nFunctions);

    if (!opt.functionPrecedence().empty()) {
      std::string precedence;
      ifstream precedence_file (opt.functionPrecedence().c_str());
      if (precedence_file.is_open() && getline(precedence_file, precedence)) {
        loadPermutationFromString(aux,precedence);
        precedence_file.close();
      }
    } else {
      sortAuxBySymbolPrecedence(aux,opt,SymbolType::FUNC);
    }
  }

  DArray<int>  functionPrecedences(nFunctions);
  for(unsigned i=0;i<nFunctions;i++) {
    functionPrecedences[aux[i]]=i;
  }
  return functionPrecedences;
}